

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O2

RealType __thiscall
OpenMD::MAW::getSuggestedCutoffRadius(MAW *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  double dVar1;
  pointer piVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  RealType RVar7;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  iVar3 = AtomType::getIdent(atypes.first);
  iVar4 = AtomType::getIdent(atypes.second);
  piVar2 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)piVar2[iVar3];
  iVar3 = piVar2[iVar4];
  RVar7 = 0.0;
  if (iVar3 != -1 && lVar6 != -1) {
    lVar6 = *(long *)&(this->MixingMap).
                      super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar6].
                      super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar5 = (long)iVar3 * 0x30;
    dVar1 = *(double *)(lVar6 + 0x10 + lVar5);
    RVar7 = (*(double *)(lVar6 + 8 + lVar5) * dVar1 + 4.9) / dVar1;
  }
  return RVar7;
}

Assistant:

RealType MAW::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();
    int atid1 = atypes.first->getIdent();
    int atid2 = atypes.second->getIdent();
    int mtid1 = MAWtids[atid1];
    int mtid2 = MAWtids[atid2];

    if (mtid1 == -1 || mtid2 == -1)
      return 0.0;
    else {
      MAWInteractionData mixer = MixingMap[mtid1][mtid2];
      RealType R_e             = mixer.Re;
      RealType beta            = mixer.beta;
      // This value of the r corresponds to an energy about 1.48% of
      // the energy at the bottom of the Morse well.  For comparison, the
      // Lennard-Jones function is about 1.63% of it's minimum value at
      // a distance of 2.5 sigma.
      return (4.9 + beta * R_e) / beta;
    }
  }